

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrload.c
# Opt level: O0

FT_Error pfr_log_font_count(FT_Stream stream,FT_UInt32 section_offset,FT_Long *acount)

{
  uint uVar1;
  FT_UShort FVar2;
  uint uVar3;
  uint local_2c;
  FT_UInt result;
  FT_UInt count;
  FT_Error error;
  FT_Long *acount_local;
  FT_Stream pFStack_10;
  FT_UInt32 section_offset_local;
  FT_Stream stream_local;
  
  local_2c = 0;
  _count = (ulong *)acount;
  acount_local._4_4_ = section_offset;
  pFStack_10 = stream;
  result = FT_Stream_Seek(stream,(ulong)section_offset);
  uVar1 = local_2c;
  if (result == 0) {
    FVar2 = FT_Stream_ReadUShort(pFStack_10,(FT_Error *)&result);
    uVar3 = (uint)FVar2;
    if ((result == 0) &&
       (((0x3332 < uVar3 || (pFStack_10->size - (ulong)acount_local._4_4_ <= (ulong)(uVar3 * 5 + 2))
         ) || (uVar1 = uVar3, pFStack_10->size <= (ulong)(uVar3 * 0x17 + 0x5f))))) {
      result = 8;
      uVar1 = local_2c;
    }
  }
  local_2c = uVar1;
  *_count = (ulong)local_2c;
  return result;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  pfr_log_font_count( FT_Stream  stream,
                      FT_UInt32  section_offset,
                      FT_Long   *acount )
  {
    FT_Error  error;
    FT_UInt   count;
    FT_UInt   result = 0;


    if ( FT_STREAM_SEEK( section_offset ) ||
         FT_READ_USHORT( count )          )
      goto Exit;

    /* check maximum value and a rough minimum size:     */
    /* - no more than 13106 log fonts                    */
    /* - we need 5 bytes for a log header record         */
    /* - we need at least 18 bytes for a log font record */
    /* - the overall size is at least 95 bytes plus the  */
    /*   log header and log font records                 */
    if ( count > ( ( 1 << 16 ) - 2 ) / 5                ||
         2 + count * 5 >= stream->size - section_offset ||
         95 + count * ( 5 + 18 ) >= stream->size        )
    {
      FT_ERROR(( "pfr_log_font_count:"
                 " invalid number of logical fonts\n" ));
      error = FT_THROW( Invalid_Table );
      goto Exit;
    }

    result = count;

  Exit:
    *acount = (FT_Long)result;
    return error;
  }